

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_exception.hxx
# Opt level: O1

void __thiscall
cornerstone::rpc_exception::rpc_exception(rpc_exception *this,string *err,ptr<req_msg> *req)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  allocator<char> local_11;
  
  *(undefined ***)this = &PTR__rpc_exception_00178d10;
  (this->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (req->super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->req_).super___shared_ptr<cornerstone::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->err_,(err->_M_dataplus)._M_p,&local_11);
  return;
}

Assistant:

rpc_exception(const std::string& err, ptr<req_msg> req) : req_(req), err_(err.c_str())
    {
    }